

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadZero<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  L val;
  uint local_14;
  
  RVar1 = Load<unsigned_int>(this,instr,&local_14,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    RVar2 = Ok;
    Push(this,(Value)ZEXT416(local_14));
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadZero(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), 0);
  result[0] = val;
  Push(result);
  return RunResult::Ok;
}